

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_vector.h
# Opt level: O1

void __thiscall
bwtil::dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::dynamic_vector
          (dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,
          ulint max_length,uint width)

{
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *this_00;
  _Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  __ptr_00;
  _Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  this_01;
  pointer *__ptr_1;
  pointer *__ptr;
  pointer __p;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *local_28;
  
  this_00 = &this->bv;
  this->max_length = 0;
  this->current_length = 0;
  (this->bv)._impl._M_t.
  super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
  _M_head_impl = (bt_impl<4096UL,_(bv::allocation_policy_t)0> *)0x0;
  this->width = width;
  this->max_length = max_length;
  this_01.super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
  _M_head_impl = (_Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                  )operator_new(0x1f0);
  bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::bt_impl
            ((bt_impl<4096UL,_(bv::allocation_policy_t)0> *)
             this_01.
             super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
             ._M_head_impl,width * max_length,0x100);
  local_28 = (bt_impl<4096UL,_(bv::allocation_policy_t)0> *)0x0;
  __ptr_00.super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
  ._M_head_impl =
       (this_00->_impl)._M_t.
       super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
       .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>;
  (this_00->_impl)._M_t.
  super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false> =
       this_01.
       super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
       _M_head_impl;
  if (__ptr_00.
      super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
      _M_head_impl != (bt_impl<4096UL,_(bv::allocation_policy_t)0> *)0x0) {
    std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>::operator()
              ((default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_> *)this_00
               ,(bt_impl<4096UL,_(bv::allocation_policy_t)0> *)
                __ptr_00.
                super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                ._M_head_impl);
  }
  if (local_28 != (bt_impl<4096UL,_(bv::allocation_policy_t)0> *)0x0) {
    std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>::operator()
              ((default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_> *)
               &local_28,local_28);
  }
  return;
}

Assistant:

dynamic_vector(ulint max_length, uint width){

		this->width=width;
		this->max_length=max_length;

		/*
		 * create a dynamic bitvector with max size the max number of bits of this dynamic vector
		 * and using the default word size for the nodes of the B tree
		 */
		bv = dynamic_bitvector_type(max_length*width);

	}